

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O0

int Bmc_CollapseExpand2(sat_solver *pSat,sat_solver *pSatOn,Vec_Int_t *vLits,Vec_Int_t *vNums,
                       Vec_Int_t *vTemp,int nBTLimit,int fCanon,int fOnOffSetLit)

{
  Vec_Int_t *pVVar1;
  sat_solver *psVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  int *piVar6;
  int *local_60;
  int *pFinal;
  int nFinal;
  int status;
  int iNum;
  int j;
  int iLit;
  int k;
  int i;
  int nBTLimit_local;
  Vec_Int_t *vTemp_local;
  Vec_Int_t *vNums_local;
  Vec_Int_t *vLits_local;
  sat_solver *pSatOn_local;
  sat_solver *pSat_local;
  
  k = nBTLimit;
  _i = vTemp;
  vTemp_local = vNums;
  vNums_local = vLits;
  vLits_local = (Vec_Int_t *)pSatOn;
  pSatOn_local = pSat;
  if (fCanon == 0) {
    if (-1 < fOnOffSetLit) {
      Vec_IntPush(vLits,fOnOffSetLit);
    }
    psVar2 = pSatOn_local;
    piVar5 = Vec_IntArray(vNums_local);
    piVar6 = Vec_IntLimit(vNums_local);
    pFinal._4_4_ = sat_solver_solve(psVar2,piVar5,piVar6,(long)k,0,0,0);
    if (-1 < fOnOffSetLit) {
      Vec_IntPop(vNums_local);
    }
    if (pFinal._4_4_ == 0) {
      return -1;
    }
    if (pFinal._4_4_ != -1) {
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                    ,0x1f2,
                    "int Bmc_CollapseExpand2(sat_solver *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                   );
    }
    pFinal._0_4_ = sat_solver_final(pSatOn_local,&local_60);
    Vec_IntClear(vTemp_local);
    Vec_IntClear(_i);
    if (-1 < fOnOffSetLit) {
      Vec_IntPush(_i,fOnOffSetLit);
    }
    for (iLit = 0; iVar4 = iLit, iVar3 = Vec_IntSize(vNums_local), psVar2 = pSatOn_local,
        iVar4 < iVar3; iLit = iLit + 1) {
      iNum = Vec_IntEntry(vNums_local,iLit);
      j = 0;
      while ((iVar4 = iNum, j < (int)pFinal && (iVar3 = Abc_LitNot(local_60[j]), iVar4 != iVar3))) {
        j = j + 1;
      }
      if (j != (int)pFinal) {
        Vec_IntPush(vTemp_local,iLit);
        Vec_IntPush(_i,iNum);
      }
    }
    piVar5 = Vec_IntArray(_i);
    piVar6 = Vec_IntLimit(_i);
    pFinal._4_4_ = sat_solver_solve(psVar2,piVar5,piVar6,(long)k,0,0,0);
    if (pFinal._4_4_ == 0) {
      return -1;
    }
    if (pFinal._4_4_ != -1) {
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                    ,0x20c,
                    "int Bmc_CollapseExpand2(sat_solver *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                   );
    }
    pFinal._0_4_ = sat_solver_final(pSatOn_local,&local_60);
    status = 0;
    for (iLit = 0; iVar4 = iLit, iVar3 = Vec_IntSize(_i), iVar4 < iVar3; iLit = iLit + 1) {
      iNum = Vec_IntEntry(_i,iLit);
      if (iNum != fOnOffSetLit) {
        j = 0;
        while ((iVar4 = iNum, j < (int)pFinal && (iVar3 = Abc_LitNot(local_60[j]), iVar4 != iVar3)))
        {
          j = j + 1;
        }
        pVVar1 = vTemp_local;
        iVar4 = status;
        if (j != (int)pFinal) {
          status = status + 1;
          iVar3 = Vec_IntEntry(vTemp_local,iLit);
          Vec_IntWriteEntry(pVVar1,iVar4,iVar3);
        }
      }
    }
    Vec_IntShrink(vTemp_local,status);
    for (iLit = 0; iVar4 = iLit, iVar3 = Vec_IntSize(vTemp_local), iVar4 < iVar3; iLit = iLit + 1) {
      Vec_IntClear(_i);
      if (-1 < fOnOffSetLit) {
        Vec_IntPush(_i,fOnOffSetLit);
      }
      for (j = 0; iVar4 = j, iVar3 = Vec_IntSize(vTemp_local), psVar2 = pSatOn_local, iVar4 < iVar3;
          j = j + 1) {
        nFinal = Vec_IntEntry(vTemp_local,j);
        pVVar1 = _i;
        if (j != iLit) {
          iVar4 = Vec_IntEntry(vNums_local,nFinal);
          Vec_IntPush(pVVar1,iVar4);
        }
      }
      piVar5 = Vec_IntArray(_i);
      piVar6 = Vec_IntLimit(_i);
      pFinal._4_4_ = sat_solver_solve(psVar2,piVar5,piVar6,(long)k,0,0,0);
      if (pFinal._4_4_ == 0) {
        return -1;
      }
      if (pFinal._4_4_ != 1) {
        Vec_IntDrop(vTemp_local,iLit);
        iLit = iLit + -1;
      }
    }
  }
  else {
    iVar4 = Bmc_CollapseExpandRound(pSat,pSatOn,vLits,vNums,vTemp,nBTLimit,fCanon,-1);
    if (iVar4 == -1) {
      return -1;
    }
    iVar4 = Bmc_CollapseExpandRound
                      (pSatOn_local,(sat_solver *)0x0,vNums_local,vTemp_local,_i,k,fCanon,-1);
    if (iVar4 == -1) {
      return -1;
    }
  }
  return 0;
}

Assistant:

int Bmc_CollapseExpand2( sat_solver * pSat, sat_solver * pSatOn, Vec_Int_t * vLits, Vec_Int_t * vNums, Vec_Int_t * vTemp, int nBTLimit, int fCanon, int fOnOffSetLit )
{
    // perform one quick reduction if it is non-canonical
    if ( !fCanon )
    {
        int i, k, iLit, j, iNum, status, nFinal, * pFinal;

        // check against offset
        if ( fOnOffSetLit >= 0 )
            Vec_IntPush( vLits, fOnOffSetLit );
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
        if ( fOnOffSetLit >= 0 )
            Vec_IntPop( vLits );
        if ( status == l_Undef )
            return -1;
        assert( status == l_False );

        // get subset of literals
        nFinal = sat_solver_final( pSat, &pFinal );
        Vec_IntClear( vNums );
        Vec_IntClear( vTemp );
        if ( fOnOffSetLit >= 0 )
        {
            //Vec_IntPush( vNums, -1 );
            Vec_IntPush( vTemp, fOnOffSetLit );
        }
        Vec_IntForEachEntry( vLits, iLit, i )
        {
            for ( k = 0; k < nFinal; k++ )
                if ( iLit == Abc_LitNot(pFinal[k]) )
                    break;
            if ( k == nFinal )
                continue;
            Vec_IntPush( vNums, i );
            Vec_IntPush( vTemp, iLit );
        }

        // check against offset
        status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return -1;
        assert( status == l_False );

        // get subset of literals
        nFinal = sat_solver_final( pSat, &pFinal );
        j = 0;
        Vec_IntForEachEntry( vTemp, iLit, i )
        {
            if ( iLit == fOnOffSetLit )
                continue;
            for ( k = 0; k < nFinal; k++ )
                if ( iLit == Abc_LitNot(pFinal[k]) )
                    break;
            if ( k == nFinal )
                continue;
            Vec_IntWriteEntry( vNums, j++, Vec_IntEntry(vNums, i) );
        }
        Vec_IntShrink( vNums, j );


        // try removing each literal
        for ( i = 0; i < Vec_IntSize(vNums); i++ )
        {
            Vec_IntClear( vTemp );
            if ( fOnOffSetLit >= 0 )
                Vec_IntPush( vTemp, fOnOffSetLit );
            Vec_IntForEachEntry( vNums, iNum, k )
                if ( k != i )
                    Vec_IntPush( vTemp, Vec_IntEntry(vLits, iNum) );
            // check against offset
            status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), nBTLimit, 0, 0, 0 );
            if ( status == l_Undef )
                return -1;
            if ( status == l_True )
                continue;
            // remove literal
            Vec_IntDrop( vNums, i );
            i--;
        }
    }
    else
    {
        if ( Bmc_CollapseExpandRound( pSat, pSatOn, vLits, vNums, vTemp, nBTLimit, fCanon, -1 ) == -1 )
            return -1;
        if ( Bmc_CollapseExpandRound( pSat, NULL,   vLits, vNums, vTemp, nBTLimit, fCanon, -1 ) == -1 )
            return -1;
    }
/*
    {
        // put into new array
        int i, iLit;
        Vec_IntClear( vNums );
        Vec_IntForEachEntry( vLits, iLit, i )
            if ( iLit != -1 )
                Vec_IntPush( vNums, i );
        //printf( "%d(%d) ", Vec_IntSize(vNums), Vec_IntSize(vLits) );
    }
*/
    return 0;
}